

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseFalse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch CVar1;
  bool bVar2;
  GenericStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  ParseErrorCode in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 b;
  
  GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
  if (CVar1 == 'a') {
    GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  }
  b = false;
  if (CVar1 == 'a') {
    CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
    if (CVar1 == 'l') {
      GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
    }
    b = false;
    if (CVar1 == 'l') {
      CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
      if (CVar1 == 's') {
        GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
      }
      b = false;
      if (CVar1 == 's') {
        CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
        b = CVar1 == 'e';
        if ((bool)b) {
          GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
        }
      }
    }
  }
  if ((bool)b == false) {
    GenericStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(b,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,0x1ec8f0);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x1ec8fc);
  }
  else {
    bVar2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Bool(in_RDI,(bool)b);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      GenericStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(b,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,0x1ec8b0);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x1ec8bc);
    }
  }
  return;
}

Assistant:

void ParseFalse(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'f');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'a') && Consume(is, 'l') && Consume(is, 's') && Consume(is, 'e'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Bool(false)))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }